

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

int OSSL_PARAM_set_time_t(OSSL_PARAM *p,time_t val)

{
  int iVar1;
  OSSL_PARAM *in_stack_00000018;
  
  iVar1 = OSSL_PARAM_set_int64(in_stack_00000018,(int64_t)p);
  return iVar1;
}

Assistant:

int OSSL_PARAM_set_time_t(OSSL_PARAM *p, time_t val)
{
#ifndef OPENSSL_SMALL_FOOTPRINT
    switch (sizeof(time_t)) {
    case sizeof(int32_t):
        return OSSL_PARAM_set_int32(p, (int32_t)val);
    case sizeof(int64_t):
        return OSSL_PARAM_set_int64(p, (int64_t)val);
    }
#endif
    return general_set_int(p, &val, sizeof(val));
}